

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_> *
chatra::filterNativeMethods
          (vector<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>
           *__return_storage_ptr__,StringTable *sTable,
          vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
          *handlers,StringId sidClass)

{
  pointer pNVar1;
  StringId SVar2;
  pointer __args_3;
  StringId local_40;
  StringId local_3c [3];
  
  (__return_storage_ptr__->
  super__Vector_base<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<chatra::NativeMethod,_std::allocator<chatra::NativeMethod>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1 = (handlers->
           super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__args_3 = (handlers->
                  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                  )._M_impl.super__Vector_impl_data._M_start; __args_3 != pNVar1;
      __args_3 = __args_3 + 1) {
    SVar2 = getStringIdOrThrow(sTable,&__args_3->className);
    if (SVar2 == sidClass) {
      local_40 = getStringIdOrThrow(sTable,&__args_3->name);
      local_3c[0] = getStringIdOrThrow(sTable,&__args_3->subName);
      std::vector<chatra::NativeMethod,std::allocator<chatra::NativeMethod>>::
      emplace_back<chatra::StringId,chatra::StringId,void(&)(void(*)(chatra::NativeCallContext&),chatra::Thread&,chatra::ObjectBase*,chatra::StringId,chatra::StringId,chatra::Tuple&,chatra::Reference),void(*const&)(chatra::NativeCallContext&)>
                ((vector<chatra::NativeMethod,std::allocator<chatra::NativeMethod>> *)
                 __return_storage_ptr__,&local_40,local_3c,nativeCall,&__args_3->handler);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<NativeMethod> filterNativeMethods(
		const StringTable* sTable, const std::vector<NativeCallHandlerInfo>& handlers, StringId sidClass = StringId::Invalid) {

	std::vector<NativeMethod> ret;
	for (auto& e : handlers) {
		try {
			if (sidClass == getStringIdOrThrow(sTable, e.className)) {
				ret.emplace_back(getStringIdOrThrow(sTable, e.name), getStringIdOrThrow(sTable, e.subName),
						nativeCall, e.handler);
			}
		}
		catch (RuntimeException&) {
			// do nothing
		}
	}
	return ret;
}